

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__dup(int fd)

{
  int fd_00;
  int iVar1;
  int *piVar2;
  
  fd_00 = dup(fd);
  if (fd_00 == -1) {
    piVar2 = __errno_location();
    fd_00 = -*piVar2;
  }
  else {
    iVar1 = uv__cloexec_ioctl(fd_00,1);
    if (iVar1 != 0) {
      uv__close(fd_00);
      fd_00 = iVar1;
    }
  }
  return fd_00;
}

Assistant:

int uv__dup(int fd) {
  int err;

  fd = dup(fd);

  if (fd == -1)
    return -errno;

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
}